

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall crnlib::mipmapped_texture::is_vertical_cross(mipmapped_texture *this)

{
  uint uVar1;
  uint uVar2;
  
  if ((((this->m_faces).m_size == 1) && (uVar1 = this->m_height, uVar1 - 1 < (uVar1 ^ uVar1 - 1)))
     && (uVar2 = this->m_width, (uVar2 ^ uVar2 - 1) <= uVar2 - 1)) {
    return uVar1 >> 2 == uVar2 / 3;
  }
  return false;
}

Assistant:

bool mipmapped_texture::is_vertical_cross() const {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  if (get_num_faces() > 1)
    return false;

  if (!((math::is_power_of_2(m_height)) && (!math::is_power_of_2(m_width)) && (m_height / 4U == m_width / 3U)))
    return false;

  return true;
}